

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O1

void qclab::printMatrix4x4<qclab::dense::SquareMatrix<std::complex<double>>>
               (SquareMatrix<std::complex<double>_> *mat)

{
  char cVar1;
  qclab *pqVar2;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 extraout_RDX_10;
  undefined8 extraout_RDX_11;
  undefined8 extraout_RDX_12;
  undefined8 extraout_RDX_13;
  undefined8 in_RSI;
  ulong uVar3;
  complex<double> val;
  complex<double> val_00;
  complex<double> val_01;
  complex<double> val_02;
  complex<double> val_03;
  complex<double> val_04;
  complex<double> val_05;
  complex<double> val_06;
  complex<double> val_07;
  complex<double> val_08;
  complex<double> val_09;
  complex<double> val_10;
  complex<double> val_11;
  complex<double> val_12;
  complex<double> val_13;
  complex<double> val_14;
  
  if (mat->size_ == 4) {
    val._M_value._8_8_ = in_RDX;
    val._M_value._0_8_ = in_RSI;
    print<double>((qclab *)mat,val);
    val_00._M_value._8_8_ = extraout_RDX;
    val_00._M_value._0_8_ = in_RSI;
    print<double>((qclab *)mat,val_00);
    val_01._M_value._8_8_ = extraout_RDX_00;
    val_01._M_value._0_8_ = in_RSI;
    print<double>((qclab *)mat,val_01);
    val_02._M_value._8_8_ = extraout_RDX_01;
    val_02._M_value._0_8_ = in_RSI;
    print<double>((qclab *)mat,val_02);
    cVar1 = std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    uVar3 = (ulong)(uint)(int)cVar1;
    pqVar2 = (qclab *)std::ostream::put('\0');
    std::ostream::flush();
    val_03._M_value._8_8_ = extraout_RDX_02;
    val_03._M_value._0_8_ = uVar3;
    print<double>(pqVar2,val_03);
    val_04._M_value._8_8_ = extraout_RDX_03;
    val_04._M_value._0_8_ = uVar3;
    print<double>(pqVar2,val_04);
    val_05._M_value._8_8_ = extraout_RDX_04;
    val_05._M_value._0_8_ = uVar3;
    print<double>(pqVar2,val_05);
    val_06._M_value._8_8_ = extraout_RDX_05;
    val_06._M_value._0_8_ = uVar3;
    print<double>(pqVar2,val_06);
    cVar1 = std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    uVar3 = (ulong)(uint)(int)cVar1;
    pqVar2 = (qclab *)std::ostream::put('\0');
    std::ostream::flush();
    val_07._M_value._8_8_ = extraout_RDX_06;
    val_07._M_value._0_8_ = uVar3;
    print<double>(pqVar2,val_07);
    val_08._M_value._8_8_ = extraout_RDX_07;
    val_08._M_value._0_8_ = uVar3;
    print<double>(pqVar2,val_08);
    val_09._M_value._8_8_ = extraout_RDX_08;
    val_09._M_value._0_8_ = uVar3;
    print<double>(pqVar2,val_09);
    val_10._M_value._8_8_ = extraout_RDX_09;
    val_10._M_value._0_8_ = uVar3;
    print<double>(pqVar2,val_10);
    cVar1 = std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    uVar3 = (ulong)(uint)(int)cVar1;
    pqVar2 = (qclab *)std::ostream::put('\0');
    std::ostream::flush();
    val_11._M_value._8_8_ = extraout_RDX_10;
    val_11._M_value._0_8_ = uVar3;
    print<double>(pqVar2,val_11);
    val_12._M_value._8_8_ = extraout_RDX_11;
    val_12._M_value._0_8_ = uVar3;
    print<double>(pqVar2,val_12);
    val_13._M_value._8_8_ = extraout_RDX_12;
    val_13._M_value._0_8_ = uVar3;
    print<double>(pqVar2,val_13);
    val_14._M_value._8_8_ = extraout_RDX_13;
    val_14._M_value._0_8_ = uVar3;
    print<double>(pqVar2,val_14);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
    return;
  }
  __assert_fail("mat.rows() == 4",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/include/qclab/util.hpp"
                ,0x6a,
                "void qclab::printMatrix4x4(const T &) [T = qclab::dense::SquareMatrix<std::complex<double>>]"
               );
}

Assistant:

void printMatrix4x4( const T& mat ) {
    assert( mat.rows() == 4 ) ;
    assert( mat.cols() == 4 ) ;
    print( mat(0,0) ); print( mat(0,1) ); print( mat(0,2) ); print( mat(0,3) );
    std::cout << std::endl ;
    print( mat(1,0) ); print( mat(1,1) ); print( mat(1,2) ); print( mat(1,3) );
    std::cout << std::endl ;
    print( mat(2,0) ); print( mat(2,1) ); print( mat(2,2) ); print( mat(2,3) );
    std::cout << std::endl ;
    print( mat(3,0) ); print( mat(3,1) ); print( mat(3,2) ); print( mat(3,3) );
    std::cout << std::endl ;
  }